

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::builtins::QueueDeleteMethod::eval
          (ConstantValue *__return_storage_ptr__,QueueDeleteMethod *this,EvalContext *context,
          Args *args,SourceRange param_3,SystemCallInfo *param_4)

{
  SVQueue *this_00;
  _Map_pointer ppCVar1;
  _Elt_pointer pCVar2;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar3;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_01;
  optional<int> oVar4;
  Diagnostic *pDVar5;
  ulong uVar6;
  ulong uVar7;
  _Map_pointer ppCVar8;
  LValue lval;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_218;
  iterator local_1f0;
  iterator local_1d0;
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
  local_1b0;
  
  Expression::evalLValue((LValue *)&local_1b0,*args->_M_ptr,context);
  if (local_1b0._M_index != '\0') {
    __v = &LValue::resolve((LValue *)&local_1b0)->value;
    pvVar3 = std::
             get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (__v);
    this_00 = pvVar3->ptr;
    if ((args->_M_extent)._M_extent_value != 1) {
      Expression::eval((ConstantValue *)&_Stack_218,args->_M_ptr[1],context);
      this_01 = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)&_Stack_218);
      oVar4 = SVInt::as<int>(this_01);
      if (((ulong)oVar4.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x180000000) == 0x100000000) {
        uVar7 = (ulong)(oVar4.super__Optional_base<int,_true,_true>._M_payload.
                        super__Optional_payload_base<int>._M_payload & 0x7fffffff);
        ppCVar1 = (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                  ).super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        ppCVar8 = (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                  ).super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_node;
        pCVar2 = (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                 .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
        if (((long)(this_00->
                   super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_last - (long)pCVar2 >> 3) *
            -0x3333333333333333 +
            ((long)(this_00->
                   super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)(this_00->
                   super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                   super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x3333333333333333 +
            (((long)ppCVar1 - (long)ppCVar8 >> 3) + -1 + (ulong)(ppCVar1 == (_Map_pointer)0x0)) *
            0xc <= uVar7) goto LAB_003fa780;
        uVar6 = ((long)pCVar2 -
                 (long)(this_00->
                       super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x3333333333333333
                + uVar7;
        if (uVar6 < 0xc) {
          local_1f0._M_cur = pCVar2 + uVar7;
        }
        else {
          if ((long)uVar6 < 1) {
            uVar7 = ~(~uVar6 / 0xc);
          }
          else {
            uVar7 = uVar6 / 0xc;
          }
          ppCVar8 = ppCVar8 + uVar7;
          local_1f0._M_cur = *ppCVar8 + uVar7 * -0xc + uVar6;
        }
        local_1f0._M_first = *ppCVar8;
        local_1f0._M_last = local_1f0._M_first + 0xc;
        local_1f0._M_node = ppCVar8;
        std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::_M_erase
                  (&local_1d0,
                   &this_00->
                    super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
                   &local_1f0);
      }
      else {
LAB_003fa780:
        pDVar5 = EvalContext::addDiag(context,(DiagCode)0x23000c,args->_M_ptr[1]->sourceRange);
        pDVar5 = Diagnostic::operator<<(pDVar5,(ConstantValue *)&_Stack_218);
        pDVar5 = ast::operator<<(pDVar5,((*args->_M_ptr)->type).ptr);
        ppCVar8 = (this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                  ).super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        local_1f0._M_cur =
             (_Elt_pointer)
             (((long)(this_00->
                     super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                     super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_last -
               (long)(this_00->
                     super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                     super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x3333333333333333 +
             ((long)(this_00->
                    super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this_00->
                    super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x3333333333333333 +
             (((long)ppCVar8 -
               (long)(this_00->
                     super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                     super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(ppCVar8 == (_Map_pointer)0x0)) * 0xc);
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar5->args,(unsigned_long *)&local_1f0);
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\0';
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&_Stack_218);
      goto LAB_003fa88e;
    }
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::clear
              (&this_00->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           .
           super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
   + 0x20) = '\0';
LAB_003fa88e:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>::
  ~_Variant_storage(&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        auto target = lval.resolve();
        SLANG_ASSERT(target && target->isQueue());
        auto& q = *target->queue();

        // If no arguments, clear the queue.
        if (args.size() == 1) {
            q.clear();
            return nullptr;
        }

        auto ci = args[1]->eval(context);
        std::optional<int32_t> index = ci.integer().as<int32_t>();
        if (!index || *index < 0 || size_t(*index) >= q.size()) {
            context.addDiag(diag::ConstEvalDynamicArrayIndex, args[1]->sourceRange)
                << ci << *args[0]->type << q.size();
            return nullptr;
        }

        q.erase(q.begin() + *index);
        return nullptr;
    }